

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountCase::init
          (OutputCountCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  reference piVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  uint *puVar10;
  InternalError *this_01;
  size_type sVar11;
  OutputCountShader *this_02;
  EVP_PKEY_CTX *ctx_00;
  int local_894;
  MessageBuilder local_890;
  int local_710;
  int local_70c;
  int ndx;
  undefined1 local_585;
  int local_584;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined1 local_539;
  string local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f2;
  allocator<char> local_4f1;
  string local_4f0;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1d0;
  deUint32 local_40;
  ContextType local_3c;
  int local_38;
  int local_34;
  GLint maxComponents;
  GLint maxVertices;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  int local_18 [2];
  int testVertices;
  int componentsPerVertex;
  OutputCountCase *this_local;
  
  local_18[1] = 8;
  _testVertices = this;
  local_28._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&(this->m_spec).pattern);
  _maxComponents = std::vector<int,_std::allocator<int>_>::end(&(this->m_spec).pattern);
  local_20 = std::
             max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (local_28,_maxComponents);
  piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_20);
  local_18[0] = *piVar4;
  local_34 = 0;
  local_38 = 0;
  pRVar5 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_3c.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  local_40 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_3c,(ApiType)local_40);
  if (!bVar2) {
    this_00 = Context::getContextInfo
                        ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
    if (!bVar2) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,"Tests require GL_EXT_geometry_shader extension or higher context version.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x9c0);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pRVar5 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))(0x8de0,&local_34);
  pRVar5 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x868))(0x8de1,&local_38);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [35])0xf50dc1);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_34);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_350,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [43])0xf50de5);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_38);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_350);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_4d0,(char (*) [25])"Components per vertex = ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_18 + 1);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4d0);
  if (local_18[0] == -1) {
    iVar3 = de::min<int>(local_34,local_38 / 8);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(this->m_spec).pattern,0);
    *pvVar9 = iVar3;
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&(this->m_spec).pattern,0);
    uVar1 = *puVar10;
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&(this->m_spec).pattern,0);
    *puVar10 = uVar1 & 0xfffffffe;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(this->m_spec).pattern,0);
    if (*pvVar9 == 0) {
      local_4f2 = 1;
      this_01 = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f0,"Pattern size is invalid.",&local_4f1);
      tcu::InternalError::InternalError(this_01,&local_4f0);
      local_4f2 = 0;
      __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
  }
  else {
    if (local_34 < local_18[0]) {
      local_539 = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_538,local_18);
      std::operator+(&local_518,&local_538," output vertices required.");
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_518);
      local_539 = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    if (local_38 < local_18[0] * 8) {
      local_585 = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_584 = local_18[0] << 3;
      de::toString<int>(&local_580,&local_584);
      std::operator+(&local_560,&local_580," output components required.");
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_560);
      local_585 = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&ndx,(char (*) [11])"Rendering ");
  sVar11 = std::vector<int,_std::allocator<int>_>::size(&(this->m_spec).pattern);
  local_70c = (int)sVar11;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_70c);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (pMVar8,(char (*) [70])
                             " row(s).\nOne geometry shader invocation generates one row.\nRow sizes:"
                     );
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
  for (local_710 = 0; iVar3 = local_710,
      sVar11 = std::vector<int,_std::allocator<int>_>::size(&(this->m_spec).pattern),
      iVar3 < (int)sVar11; local_710 = local_710 + 1) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_890,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_890,(char (*) [5])"Row ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_710);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xf96de6);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->m_spec).pattern,(long)local_710);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,pvVar9);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])0xf16194);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_890);
  }
  this_02 = (OutputCountShader *)operator_new(0x178);
  pRVar5 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_894 = (*pRVar5->_vptr_RenderContext[2])();
  ctx_00 = (EVP_PKEY_CTX *)&local_894;
  OutputCountShader::OutputCountShader(this_02,(ContextType *)ctx_00,&this->m_spec);
  this->m_program = this_02;
  iVar3 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar3;
}

Assistant:

void OutputCountCase::init (void)
{
	// Check requirements and adapt to them
	{
		const int	componentsPerVertex	= 4 + 4; // vec4 pos, vec4 color
		const int	testVertices		= *std::max_element(m_spec.pattern.begin(), m_spec.pattern.end());
		glw::GLint	maxVertices			= 0;
		glw::GLint	maxComponents		= 0;

		// check the extension before querying anything
		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
			TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_OUTPUT_VERTICES, &maxVertices);
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_OUTPUT_VERTICES = " << maxVertices << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = " << maxComponents << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Components per vertex = " << componentsPerVertex << tcu::TestLog::EndMessage;

		if (testVertices == -1)
		{
			// "max vertices"-case
			DE_ASSERT((int)m_spec.pattern.size() == 1);
			m_spec.pattern[0] = de::min(maxVertices, maxComponents / componentsPerVertex);

			// make sure size is dividable by 2, as OutputShader requires
			m_spec.pattern[0] = m_spec.pattern[0] & ~0x00000001;

			if (m_spec.pattern[0] == 0)
				throw tcu::InternalError("Pattern size is invalid.");
		}
		else
		{
			// normal case
			if (testVertices > maxVertices)
				throw tcu::NotSupportedError(de::toString(testVertices) + " output vertices required.");
			if (testVertices * componentsPerVertex > maxComponents)
				throw tcu::NotSupportedError(de::toString(testVertices * componentsPerVertex) + " output components required.");
		}
	}

	// Log what the test tries to do

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << (int)m_spec.pattern.size() << " row(s).\nOne geometry shader invocation generates one row.\nRow sizes:" << tcu::TestLog::EndMessage;
	for (int ndx = 0; ndx < (int)m_spec.pattern.size(); ++ndx)
		m_testCtx.getLog() << tcu::TestLog::Message << "Row " << ndx << ": " << m_spec.pattern[ndx] << " vertices." << tcu::TestLog::EndMessage;

	// Gen shader
	DE_ASSERT(!m_program);
	m_program = new OutputCountShader(m_context.getRenderContext().getType(), m_spec);

	// Case init
	GeometryShaderRenderTest::init();
}